

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O1

size_t PHF::uniq<std::__cxx11::string>
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,size_t n)

{
  size_t __n;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  
  qsort(k,n,0x20,Uniq::cmp<std::__cxx11::string>);
  sVar4 = 1;
  if (1 < n) {
    lVar3 = n - 1;
    pbVar2 = k + 1;
    lVar5 = 0;
    do {
      __n = pbVar2->_M_string_length;
      if (__n == k[lVar5]._M_string_length) {
        if (__n != 0) {
          iVar1 = bcmp((pbVar2->_M_dataplus)._M_p,k[lVar5]._M_dataplus._M_p,__n);
          if (iVar1 != 0) goto LAB_00121173;
        }
      }
      else {
LAB_00121173:
        lVar5 = lVar5 + 1;
        std::__cxx11::string::_M_assign((string *)(k + lVar5));
      }
      pbVar2 = pbVar2 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    sVar4 = lVar5 + 1;
  }
  if (n == 0) {
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

PHF_PUBLIC size_t PHF::uniq(key_t k[], const size_t n) {
	using namespace PHF::Uniq;
	size_t i, j;

	qsort(k, n, sizeof *k, reinterpret_cast<int(*)(const void *, const void *)>(&cmp<key_t>));

	for (i = 1, j = 0; i < n; i++) {
		if (k[i] != k[j])
			k[++j] = k[i];
	}

	return (n > 0)? j + 1 : 0;
}